

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O2

_Bool Curl_conn_is_tcp_listen(Curl_easy *data,int sockindex)

{
  Curl_cfilter *pCVar1;
  Curl_cfilter **ppCVar2;
  
  ppCVar2 = data->conn->cfilter + sockindex;
  do {
    pCVar1 = *ppCVar2;
    if (pCVar1 == (Curl_cfilter *)0x0) break;
    ppCVar2 = &pCVar1->next;
  } while (pCVar1->cft != &Curl_cft_tcp_accept);
  return pCVar1 != (Curl_cfilter *)0x0;
}

Assistant:

bool Curl_conn_is_tcp_listen(struct Curl_easy *data,
                             int sockindex)
{
  struct Curl_cfilter *cf = data->conn->cfilter[sockindex];
  while(cf) {
    if(cf->cft == &Curl_cft_tcp_accept)
      return TRUE;
    cf = cf->next;
  }
  return FALSE;
}